

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

void __thiscall fasttext::Autotune::startTimer(Autotune *this,Args *args)

{
  thread *this_00;
  type *in_RDI;
  __sighandler_t previousSignalHandler;
  time_point start;
  thread *in_stack_fffffffffffffe10;
  anon_class_16_2_37b75eea *in_stack_fffffffffffffe28;
  function<void_()> *in_stack_fffffffffffffe30;
  type *__f;
  Args *in_stack_fffffffffffffe58;
  Args *in_stack_fffffffffffffe60;
  
  this_00 = (thread *)std::chrono::_V2::steady_clock::now();
  __f = in_RDI;
  Args::Args(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::thread::thread<fasttext::Autotune::startTimer(fasttext::Args_const&)::__1,,void>(this_00,__f)
  ;
  std::thread::operator=(in_stack_fffffffffffffe10,(thread *)in_RDI);
  std::thread::~thread((thread *)0x117b31);
  startTimer(fasttext::Args_const&)::$_1::~__1((type *)0x117b3b);
  (in_RDI->args).manualArgs_._M_h._M_buckets = (__buckets_ptr)0xbff0000000000000;
  *(undefined4 *)&(in_RDI->args).manualArgs_._M_h._M_bucket_count = 0;
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_fffffffffffffe10,SUB81((ulong)in_RDI >> 0x38,0));
  signal(2,anon_unknown.dwarf_2e523::signalHandler);
  std::function<void()>::operator=(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  return;
}

Assistant:

void Autotune::startTimer(const Args& args) {
  std::chrono::steady_clock::time_point start =
      std::chrono::steady_clock::now();
  timer_ = std::thread([=]() { timer(start, args.autotuneDuration); });
  bestScore_ = kUnknownBestScore;
  trials_ = 0;
  continueTraining_ = true;

  auto previousSignalHandler = std::signal(SIGINT, signalHandler);
  interruptSignalHandler = [&]() {
    std::signal(SIGINT, previousSignalHandler);
    std::cerr << std::endl << "Aborting autotune..." << std::endl;
    abort();
  };
}